

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O3

bool __thiscall ON_Brep::SetTrimIsoFlags(ON_Brep *this,ON_BrepTrim *trim)

{
  int iVar1;
  ON_Curve *pOVar2;
  ISO IVar3;
  ON_Surface *pOVar4;
  ON_Interval PD;
  
  iVar1 = trim->m_li;
  if ((-1 < (long)iVar1) &&
     (iVar1 < (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count
     )) {
    iVar1 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a
            [iVar1].m_fi;
    if ((-1 < (long)iVar1) &&
       ((iVar1 < (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.
                 m_count &&
        (pOVar4 = ON_BrepFace::SurfaceOf
                            ((this->m_F).super_ON_ObjectArray<ON_BrepFace>.
                             super_ON_ClassArray<ON_BrepFace>.m_a + iVar1),
        pOVar4 != (ON_Surface *)0x0)))) {
      iVar1 = trim->m_c2i;
      if ((long)iVar1 < 0) {
        return false;
      }
      if ((this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_count <= iVar1) {
        return false;
      }
      pOVar2 = (this->m_C2).super_ON_SimpleArray<ON_Curve_*>.m_a[iVar1];
      if (pOVar2 != (ON_Curve *)0x0) {
        ON_CurveProxy::ProxyCurveDomain(&trim->super_ON_CurveProxy);
        IVar3 = (*(pOVar4->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2d])(pOVar4,pOVar2);
        trim->m_iso = IVar3;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool
ON_Brep::SetTrimIsoFlags( ON_BrepTrim& trim )
{
  bool rc = false;
  if ( trim.m_li >= 0 && trim.m_li < m_L.Count() )
  {
    const int fi = m_L[trim.m_li].m_fi;
    if ( fi >= 0 && fi < m_F.Count() )
    {
      const ON_Surface* pS = m_F[fi].SurfaceOf();
      if ( pS )
      {
        const ON_Curve* pC = (trim.m_c2i >= 0 && trim.m_c2i < m_C2.Count()) 
                           ? m_C2[trim.m_c2i]
                           : 0;
        if ( pC ) 
        {
          ON_Interval PD = trim.ProxyCurveDomain(); 
          trim.m_iso = pS->IsIsoparametric( *pC, &PD);
          rc = true;
        }
      }
    }
  }
  return rc;
}